

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

void __thiscall
TwoStageDynamicBayesianNetwork::~TwoStageDynamicBayesianNetwork
          (TwoStageDynamicBayesianNetwork *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppCVar5;
  reference ppvVar6;
  reference ppuVar7;
  long in_RDI;
  iterator it_1;
  iterator it;
  Index i_1;
  Index i;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  *in_stack_fffffffffffffe58;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *in_stack_fffffffffffffe60
  ;
  void *pvVar8;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *in_stack_fffffffffffffe68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe70;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *this_00;
  __normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
  local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_20;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  local_18;
  uint local_10;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    uVar3 = (ulong)local_c;
    sVar4 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::size
                      ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                       (in_RDI + 0x280));
    if (uVar3 == sVar4) break;
    ppCVar5 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                        (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
    if (*ppCVar5 != (value_type)0x0) {
      (*(*ppCVar5)->_vptr_CPDDiscreteInterface[1])();
    }
    local_c = local_c + 1;
  }
  local_10 = 0;
  while( true ) {
    uVar3 = (ulong)local_10;
    sVar4 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::size
                      ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                       (in_RDI + 0x298));
    if (uVar3 == sVar4) break;
    ppCVar5 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                        (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
    if (*ppCVar5 != (value_type)0x0) {
      (*(*ppCVar5)->_vptr_CPDDiscreteInterface[1])();
    }
    local_10 = local_10 + 1;
  }
  __gnu_cxx::
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  ::__normal_iterator(&local_18);
  local_20 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ::begin(in_stack_fffffffffffffe58);
  local_18._M_current = local_20;
  while( true ) {
    local_28 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ::end(in_stack_fffffffffffffe58);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar2) break;
    ppvVar6 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              ::operator*(&local_18);
    pvVar1 = *ppvVar6;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe70);
      operator_delete(pvVar1,0x18);
    }
    local_30 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               __gnu_cxx::
               __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
               ::operator++(in_stack_fffffffffffffe68,
                            (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  local_38 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ::begin(in_stack_fffffffffffffe58);
  local_18._M_current = local_38;
  while( true ) {
    local_40 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ::end(in_stack_fffffffffffffe58);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar2) break;
    ppvVar6 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              ::operator*(&local_18);
    pvVar1 = *ppvVar6;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe70);
      operator_delete(pvVar1,0x18);
    }
    local_48 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               __gnu_cxx::
               __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
               ::operator++(in_stack_fffffffffffffe68,
                            (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  local_50 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ::begin(in_stack_fffffffffffffe58);
  local_18._M_current = local_50;
  while( true ) {
    local_58 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ::end(in_stack_fffffffffffffe58);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar2) break;
    ppvVar6 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              ::operator*(&local_18);
    pvVar1 = *ppvVar6;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe70);
      operator_delete(pvVar1,0x18);
    }
    local_60 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               __gnu_cxx::
               __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
               ::operator++(in_stack_fffffffffffffe68,
                            (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  local_68 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ::begin(in_stack_fffffffffffffe58);
  local_18._M_current = local_68;
  while( true ) {
    local_70 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ::end(in_stack_fffffffffffffe58);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar2) break;
    ppvVar6 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              ::operator*(&local_18);
    pvVar1 = *ppvVar6;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe70);
      operator_delete(pvVar1,0x18);
    }
    local_78 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               __gnu_cxx::
               __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
               ::operator++(in_stack_fffffffffffffe68,
                            (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  local_80 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ::begin(in_stack_fffffffffffffe58);
  local_18._M_current = local_80;
  while( true ) {
    local_88 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ::end(in_stack_fffffffffffffe58);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar2) break;
    ppvVar6 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              ::operator*(&local_18);
    pvVar1 = *ppvVar6;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe70);
      operator_delete(pvVar1,0x18);
    }
    local_90 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               __gnu_cxx::
               __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
               ::operator++(in_stack_fffffffffffffe68,
                            (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  local_98 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ::begin(in_stack_fffffffffffffe58);
  local_18._M_current = local_98;
  while( true ) {
    local_a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ::end(in_stack_fffffffffffffe58);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar2) break;
    ppvVar6 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              ::operator*(&local_18);
    pvVar1 = *ppvVar6;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe70);
      operator_delete(pvVar1,0x18);
    }
    local_a8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               __gnu_cxx::
               __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
               ::operator++(in_stack_fffffffffffffe68,
                            (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  local_b0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ::begin(in_stack_fffffffffffffe58);
  local_18._M_current = local_b0;
  while( true ) {
    local_b8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ::end(in_stack_fffffffffffffe58);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar2) break;
    ppvVar6 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              ::operator*(&local_18);
    pvVar1 = *ppvVar6;
    if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe70);
      operator_delete(pvVar1,0x18);
    }
    local_c0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               __gnu_cxx::
               __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
               ::operator++(in_stack_fffffffffffffe68,
                            (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  __gnu_cxx::
  __normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
  ::__normal_iterator(&local_c8);
  local_c8._M_current =
       (unsigned_long **)
       std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::begin
                 ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
                  in_stack_fffffffffffffe58);
  while( true ) {
    std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::end
              ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
               in_stack_fffffffffffffe58);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar2) break;
    ppuVar7 = __gnu_cxx::
              __normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
              ::operator*(&local_c8);
    if (*ppuVar7 != (unsigned_long *)0x0) {
      operator_delete__(*ppuVar7);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
    ::operator++((__normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
                  *)in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  local_c8._M_current =
       (unsigned_long **)
       std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::begin
                 ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
                  in_stack_fffffffffffffe58);
  while( true ) {
    std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::end
              ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
               in_stack_fffffffffffffe58);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar2) break;
    ppuVar7 = __gnu_cxx::
              __normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
              ::operator*(&local_c8);
    if (*ppuVar7 != (unsigned_long *)0x0) {
      operator_delete__(*ppuVar7);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
    ::operator++((__normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
                  *)in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  }
  pvVar8 = *(void **)(in_RDI + 0x2b0);
  if (pvVar8 != (void *)0x0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe70);
    operator_delete(pvVar8,0x18);
  }
  pvVar8 = *(void **)(in_RDI + 0x2d0);
  if (pvVar8 != (void *)0x0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe70);
    operator_delete(pvVar8,0x18);
  }
  this_00 = *(vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> **)
             (in_RDI + 0x2f0);
  if (this_00 != (vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)0x0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    operator_delete(this_00,0x18);
  }
  pvVar8 = *(void **)(in_RDI + 0x340);
  if (pvVar8 != (void *)0x0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    operator_delete(pvVar8,0x18);
  }
  pvVar8 = *(void **)(in_RDI + 0x3a8);
  if (pvVar8 != (void *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    operator_delete(pvVar8,0x18);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             *)this_00);
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~vector
            ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)this_00);
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~vector
            ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)this_00);
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::~vector(this_00);
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::~vector(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)this_00);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)this_00);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)this_00);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)this_00);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)this_00);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)this_00);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)this_00);
  return;
}

Assistant:

TwoStageDynamicBayesianNetwork::~TwoStageDynamicBayesianNetwork()
{
    for(Index i=0;i!=_m_Y_CPDs.size();++i)
        delete _m_Y_CPDs.at(i);
    for(Index i=0;i!=_m_O_CPDs.size();++i)
        delete _m_O_CPDs.at(i);

    // delete by iterator, as temporary data may not be allocated when
    // reading from disk
    { std::vector<std::vector<Index>* >::iterator it;
        for (it=_m_X_restr_perY.begin();it!=_m_X_restr_perY.end();it++)
            delete *it;
        for (it=_m_A_restr_perY.begin();it!=_m_A_restr_perY.end();it++)
            delete *it;
        for (it=_m_Y_restr_perY.begin();it!=_m_Y_restr_perY.end();it++)
            delete *it;

        for (it=_m_X_restr_perO.begin();it!=_m_X_restr_perO.end();it++)
            delete *it;
        for (it=_m_A_restr_perO.begin();it!=_m_A_restr_perO.end();it++)
            delete *it;
        for (it=_m_Y_restr_perO.begin();it!=_m_Y_restr_perO.end();it++)
            delete *it;
        for (it=_m_O_restr_perO.begin();it!=_m_O_restr_perO.end();it++)
            delete *it;
    }
    { std::vector<size_t*>::iterator it;
        for (it=_m_nrVals_SoI_Y_stepsize.begin();it!=_m_nrVals_SoI_Y_stepsize.end();it++)
            delete [] *it;
        for (it=_m_nrVals_SoI_O_stepsize.begin();it!=_m_nrVals_SoI_O_stepsize.end();it++)
            delete [] *it;
    }

    delete _m_IndividualToJointYiiIndices_catVector;
    delete _m_IndividualToJointOiiIndices_catVector;
    delete _m_SampleY;
    delete _m_SampleO;
    delete _m_SampleNrO;
}